

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_downscaleStats(uint *table,U32 lastEltIndex,U32 shift,base_directive_e base1)

{
  U32 UVar1;
  ulong uVar2;
  uint uVar3;
  
  if (shift < 0x1e) {
    uVar2 = 0;
    UVar1 = 0;
    do {
      uVar3 = 1;
      if (base1 == base_0possible) {
        uVar3 = (uint)(table[uVar2] != 0);
      }
      uVar3 = (table[uVar2] >> ((byte)shift & 0x1f)) + uVar3;
      UVar1 = UVar1 + uVar3;
      table[uVar2] = uVar3;
      uVar2 = uVar2 + 1;
    } while (lastEltIndex + 1 != uVar2);
    return UVar1;
  }
  __assert_fail("shift < 30",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x6b,"U32 ZSTD_downscaleStats(unsigned int *, U32, U32, base_directive_e)");
}

Assistant:

static U32
ZSTD_downscaleStats(unsigned* table, U32 lastEltIndex, U32 shift, base_directive_e base1)
{
    U32 s, sum=0;
    DEBUGLOG(5, "ZSTD_downscaleStats (nbElts=%u, shift=%u)",
            (unsigned)lastEltIndex+1, (unsigned)shift );
    assert(shift < 30);
    for (s=0; s<lastEltIndex+1; s++) {
        unsigned const base = base1 ? 1 : (table[s]>0);
        unsigned const newStat = base + (table[s] >> shift);
        sum += newStat;
        table[s] = newStat;
    }
    return sum;
}